

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cpp
# Opt level: O1

uint32_t crc32c_append_sw(uint32_t crci,buffer input,size_t length)

{
  uint uVar1;
  uint uVar2;
  buffer puVar3;
  size_t sVar4;
  buffer next;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = ~crci;
  if (((ulong)input & 3) != 0 && length != 0) {
    puVar3 = input + 1;
    sVar4 = length;
    do {
      uVar2 = *(uint *)input;
      input = (buffer)((long)input + 1);
      uVar5 = uVar5 >> 8 ^ table[0][(byte)((byte)uVar2 ^ (byte)uVar5)];
      length = sVar4 - 1;
      if (sVar4 == 1) break;
      uVar6 = (ulong)puVar3 & 3;
      puVar3 = puVar3 + 1;
      sVar4 = length;
    } while (uVar6 != 0);
  }
  for (; 0xb < length; length = length - 0xc) {
    uVar5 = uVar5 ^ *(uint *)input;
    uVar2 = *(uint *)((long)input + 4);
    uVar1 = *(uint *)((long)input + 8);
    uVar5 = table[10][uVar5 >> 8 & 0xff] ^ table[0xb][uVar5 & 0xff] ^
            *(uint *)((long)table[9] + (ulong)(uVar5 >> 0xe & 0x3fc)) ^ table[8][uVar5 >> 0x18] ^
            table[7][uVar2 & 0xff] ^ table[6][uVar2 >> 8 & 0xff] ^
            *(uint *)((long)table[5] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^ table[4][uVar2 >> 0x18] ^
            table[3][uVar1 & 0xff] ^ table[2][uVar1 >> 8 & 0xff] ^
            *(uint *)((long)table[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^ table[0][uVar1 >> 0x18];
    input = (buffer)((long)input + 0xc);
  }
  if (length != 0) {
    uVar6 = 0;
    do {
      uVar5 = uVar5 >> 8 ^ table[0][(byte)(*(byte *)((long)input + uVar6) ^ (byte)uVar5)];
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  return ~uVar5;
}

Assistant:

uint32_t crc32c_append_sw(uint32_t crci, buffer input, size_t length)
{
    buffer next = input;
    uint32_t crc;

    crc = crci ^ 0xffffffff;
    while (length && ((uintptr_t)next & 3) != 0)
    {
        crc = table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
        --length;
    }
    while (length >= 12)
    {
        crc ^= *(uint32_t *)next;
        uint32_t high = *(uint32_t *)(next + 4);
        uint32_t high2 = *(uint32_t *)(next + 8);
        crc = table[11][crc & 0xff]
            ^ table[10][(crc >> 8) & 0xff]
            ^ table[9][(crc >> 16) & 0xff]
            ^ table[8][crc >> 24]
            ^ table[7][high & 0xff]
            ^ table[6][(high >> 8) & 0xff]
            ^ table[5][(high >> 16) & 0xff]
            ^ table[4][high >> 24]
            ^ table[3][high2 & 0xff]
            ^ table[2][(high2 >> 8) & 0xff]
            ^ table[1][(high2 >> 16) & 0xff]
            ^ table[0][high2 >> 24];
        next += 12;
        length -= 12;
    }
    while (length)
    {
        crc = table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
        --length;
    }
    return (uint32_t)crc ^ 0xffffffff;
}